

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

void __thiscall llvm::Obj2YamlError::~Obj2YamlError(Obj2YamlError *this)

{
  Obj2YamlError *this_local;
  
  ~Obj2YamlError(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Obj2YamlError(obj2yaml_error C) : Code(C) {}